

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall CConfigManager::Reset(CConfigManager *this)

{
  (this->m_Values).m_ClPredict = 1;
  (this->m_Values).m_ClPredictPlayers = 0;
  (this->m_Values).m_ClPredictProjectiles = 0;
  (this->m_Values).m_ClNameplates = 1;
  (this->m_Values).m_ClNameplatesAlways = 1;
  (this->m_Values).m_ClNameplatesTeamcolors = 1;
  (this->m_Values).m_ClNameplatesSize = 0x32;
  (this->m_Values).m_ClAutoswitchWeapons = 0;
  (this->m_Values).m_ClShowhud = 1;
  (this->m_Values).m_ClShowChat = 1;
  (this->m_Values).m_ClFilterchat = 0;
  (this->m_Values).m_ClDisableWhisper = 0;
  (this->m_Values).m_ClShowsocial = 1;
  (this->m_Values).m_ClShowfps = 0;
  (this->m_Values).m_ClAirjumpindicator = 1;
  (this->m_Values).m_ClWarningTeambalance = 1;
  (this->m_Values).m_ClDynamicCamera = 0;
  (this->m_Values).m_ClMouseDeadzone = 300;
  (this->m_Values).m_ClMouseFollowfactor = 0x3c;
  (this->m_Values).m_ClMouseMaxDistanceDynamic = 1000;
  (this->m_Values).m_ClMouseMaxDistanceStatic = 400;
  (this->m_Values).m_ClCameraSmoothness = 0;
  (this->m_Values).m_ClCameraStabilizing = 0;
  (this->m_Values).m_ClCustomizeSkin = 0;
  (this->m_Values).m_ClShowUserId = 0;
  (this->m_Values).m_EdZoomTarget = 1;
  (this->m_Values).m_EdShowkeys = 0;
  (this->m_Values).m_EdColorGridInner = -0xda;
  (this->m_Values).m_EdColorGridOuter = -0xb3b3b4;
  (this->m_Values).m_EdColorQuadPoint = -0xffff01;
  (this->m_Values).m_EdColorQuadPointHover = -1;
  (this->m_Values).m_EdColorQuadPointActive = -1;
  (this->m_Values).m_EdColorQuadPivot = 0xff00ff;
  (this->m_Values).m_EdColorQuadPivotHover = -1;
  (this->m_Values).m_EdColorQuadPivotActive = -1;
  (this->m_Values).m_EdColorSelectionQuad = -1;
  (this->m_Values).m_EdColorSelectionTile = -0x9a;
  (this->m_Values).m_ClShowWelcome = 1;
  (this->m_Values).m_ClMotdTime = 10;
  (this->m_Values).m_ClShowXmasHats = 1;
  (this->m_Values).m_ClShowEasterEggs = 1;
  str_copy((this->m_Values).m_ClVersionServer,"version.teeworlds.com",100);
  str_copy((this->m_Values).m_ClLanguagefile,"",0xff);
  (this->m_Values).m_PlayerColorBody = 0x1b6f74;
  (this->m_Values).m_PlayerColorMarking = -0xffff01;
  (this->m_Values).m_PlayerColorDecoration = 0x1b6f74;
  (this->m_Values).m_PlayerColorHands = 0x1b759e;
  (this->m_Values).m_PlayerColorFeet = 0x1c873e;
  (this->m_Values).m_PlayerColorEyes = 0xff;
  (this->m_Values).m_PlayerUseCustomColorBody = 1;
  (this->m_Values).m_PlayerUseCustomColorMarking = 1;
  (this->m_Values).m_PlayerUseCustomColorDecoration = 1;
  (this->m_Values).m_PlayerUseCustomColorHands = 1;
  (this->m_Values).m_PlayerUseCustomColorFeet = 1;
  (this->m_Values).m_PlayerUseCustomColorEyes = 1;
  str_utf8_copy_num((this->m_Values).m_PlayerSkin,"default",0x61,0x18);
  str_utf8_copy_num((this->m_Values).m_PlayerSkinBody,"standard",0x61,0x18);
  str_utf8_copy_num((this->m_Values).m_PlayerSkinMarking,"",0x61,0x18);
  str_utf8_copy_num((this->m_Values).m_PlayerSkinDecoration,"",0x61,0x18);
  str_utf8_copy_num((this->m_Values).m_PlayerSkinHands,"standard",0x61,0x18);
  str_utf8_copy_num((this->m_Values).m_PlayerSkinFeet,"standard",0x61,0x18);
  str_utf8_copy_num((this->m_Values).m_PlayerSkinEyes,"standard",0x61,0x18);
  (this->m_Values).m_UiBrowserPage = 5;
  (this->m_Values).m_UiSettingsPage = 0;
  str_copy((this->m_Values).m_UiServerAddress,"localhost:8303",0x40);
  str_copy((this->m_Values).m_UiServerAddressLan,"localhost:8303",0x40);
  (this->m_Values).m_UiMousesens = 100;
  (this->m_Values).m_UiJoystickSens = 100;
  (this->m_Values).m_UiAutoswitchInfotab = 1;
  (this->m_Values).m_UiWideview = 0;
  (this->m_Values).m_GfxNoclip = 0;
  str_copy((this->m_Values).m_ClMenuMap,"auto",0x40);
  (this->m_Values).m_ClShowMenuMap = 1;
  (this->m_Values).m_ClMenuAlpha = 0x19;
  (this->m_Values).m_ClRotationRadius = 0x1e;
  (this->m_Values).m_ClRotationSpeed = 0x28;
  (this->m_Values).m_ClCameraSpeed = 5;
  (this->m_Values).m_ClShowStartMenuImages = 1;
  (this->m_Values).m_ClSkipStartMenu = 0;
  (this->m_Values).m_ClHideSelfScore = 0;
  (this->m_Values).m_ClStatboardInfos = 0x4eb;
  (this->m_Values).m_ClShowLocalTimeAlways = 0;
  (this->m_Values).m_ClLastVersionPlayed = 0x704;
  (this->m_Values).m_SvWarmup = 0;
  (this->m_Values).m_SvCountdown = 0;
  str_copy((this->m_Values).m_SvMotd,"",900);
  (this->m_Values).m_SvTeamdamage = 0;
  str_copy((this->m_Values).m_SvMaprotation,"",0x300);
  (this->m_Values).m_SvMatchesPerMap = 1;
  (this->m_Values).m_SvMatchSwap = 1;
  (this->m_Values).m_SvPowerups = 1;
  (this->m_Values).m_SvScorelimit = 0x14;
  (this->m_Values).m_SvTimelimit = 0;
  str_copy((this->m_Values).m_SvGametype,"dm",0x20);
  (this->m_Values).m_SvTournamentMode = 0;
  (this->m_Values).m_SvPlayerReadyMode = 0;
  (this->m_Values).m_SvSpamprotection = 1;
  (this->m_Values).m_SvRespawnDelayTDM = 3;
  (this->m_Values).m_SvPlayerSlots = 8;
  (this->m_Values).m_SvSkillLevel = 1;
  (this->m_Values).m_SvTeambalanceTime = 1;
  (this->m_Values).m_SvInactiveKickTime = 3;
  (this->m_Values).m_SvInactiveKick = 2;
  (this->m_Values).m_SvInactiveKickSpec = 0;
  (this->m_Values).m_SvSilentSpectatorMode = 1;
  (this->m_Values).m_SvStrictSpectateMode = 0;
  (this->m_Values).m_SvVoteSpectate = 1;
  (this->m_Values).m_SvVoteSpectateRejoindelay = 3;
  (this->m_Values).m_SvVoteKick = 1;
  (this->m_Values).m_SvVoteKickMin = 0;
  (this->m_Values).m_SvVoteKickBantime = 5;
  (this->m_Values).m_DbgFocus = 0;
  (this->m_Values).m_DbgTuning = 0;
  str_utf8_copy_num((this->m_Values).m_PlayerName,"nameless tee",0x41,0x10);
  str_utf8_copy_num((this->m_Values).m_PlayerClan,"",0x31,0xc);
  (this->m_Values).m_PlayerCountry = -1;
  str_copy((this->m_Values).m_Password,"",0x20);
  str_copy((this->m_Values).m_Logfile,"",0x80);
  (this->m_Values).m_LogfileTimestamp = 0;
  (this->m_Values).m_ConsoleOutputLevel = 0;
  (this->m_Values).m_ShowConsoleWindow = 1;
  (this->m_Values).m_ClCpuThrottle = 0;
  (this->m_Values).m_ClEditor = 0;
  (this->m_Values).m_ClLoadCountryFlags = 1;
  (this->m_Values).m_ClAutoDemoRecord = 0;
  (this->m_Values).m_ClAutoDemoMax = 10;
  (this->m_Values).m_ClAutoScreenshot = 0;
  (this->m_Values).m_ClAutoStatScreenshot = 0;
  (this->m_Values).m_ClAutoScreenshotMax = 10;
  (this->m_Values).m_ClShowServerBroadcast = 1;
  (this->m_Values).m_ClColoredBroadcast = 1;
  (this->m_Values).m_ClSaveServerPasswords = 1;
  str_copy((this->m_Values).m_BrFilterString,"",0x19);
  (this->m_Values).m_BrSort = 4;
  (this->m_Values).m_BrSortOrder = 1;
  (this->m_Values).m_BrMaxRequests = 0x19;
  (this->m_Values).m_BrDemoSort = 0;
  (this->m_Values).m_BrDemoSortOrder = 0;
  (this->m_Values).m_SndBufferSize = 0x200;
  (this->m_Values).m_SndRate = 48000;
  (this->m_Values).m_SndEnable = 1;
  (this->m_Values).m_SndInit = 1;
  (this->m_Values).m_SndMusic = 1;
  (this->m_Values).m_SndVolume = 100;
  (this->m_Values).m_SndNonactiveMute = 0;
  (this->m_Values).m_SndAsyncLoading = 1;
  (this->m_Values).m_GfxScreen = 0;
  (this->m_Values).m_GfxScreenWidth = 0;
  (this->m_Values).m_GfxScreenHeight = 0;
  (this->m_Values).m_GfxBorderless = 0;
  (this->m_Values).m_GfxFullscreen = 1;
  (this->m_Values).m_GfxClear = 0;
  (this->m_Values).m_GfxVsync = 1;
  (this->m_Values).m_GfxDisplayAllModes = 0;
  (this->m_Values).m_GfxHighdpi = 1;
  (this->m_Values).m_GfxTextureCompression = 0;
  (this->m_Values).m_GfxHighDetail = 1;
  (this->m_Values).m_GfxTextureQuality = 1;
  (this->m_Values).m_GfxFsaaSamples = 0;
  (this->m_Values).m_GfxFinish = 1;
  (this->m_Values).m_GfxAsyncRender = 0;
  (this->m_Values).m_GfxMaxFps = 0x90;
  (this->m_Values).m_GfxLimitFps = 0;
  (this->m_Values).m_GfxUseX11XRandRWM = 1;
  (this->m_Values).m_InpGrab = 0;
  (this->m_Values).m_InpMousesens = 100;
  (this->m_Values).m_JoystickEnable = 0;
  str_copy((this->m_Values).m_JoystickGUID,"",0x22);
  (this->m_Values).m_JoystickAbsolute = 0;
  (this->m_Values).m_JoystickSens = 100;
  (this->m_Values).m_JoystickX = 0;
  (this->m_Values).m_JoystickY = 1;
  (this->m_Values).m_JoystickTolerance = 5;
  str_copy((this->m_Values).m_SvName,"unnamed server",0x80);
  str_copy((this->m_Values).m_SvHostname,"",0x80);
  str_copy((this->m_Values).m_Bindaddr,"",0x80);
  (this->m_Values).m_SvPort = 0x206f;
  (this->m_Values).m_SvExternalPort = 0;
  str_copy((this->m_Values).m_SvMap,"dm1",0x80);
  (this->m_Values).m_SvMaxClients = 8;
  (this->m_Values).m_SvMaxClientsPerIP = 4;
  (this->m_Values).m_SvMapDownloadSpeed = 8;
  (this->m_Values).m_SvHighBandwidth = 0;
  (this->m_Values).m_SvRegister = 1;
  str_copy((this->m_Values).m_SvRconPassword,"",0x20);
  str_copy((this->m_Values).m_SvRconModPassword,"",0x20);
  (this->m_Values).m_SvRconMaxTries = 3;
  (this->m_Values).m_SvRconBantime = 5;
  (this->m_Values).m_SvAutoDemoRecord = 0;
  (this->m_Values).m_SvAutoDemoMax = 10;
  str_copy((this->m_Values).m_SvMaplist,"all",0x20);
  str_copy((this->m_Values).m_EcBindaddr,"localhost",0x80);
  (this->m_Values).m_EcPort = 0;
  str_copy((this->m_Values).m_EcPassword,"",0x20);
  (this->m_Values).m_EcBantime = 0;
  (this->m_Values).m_EcAuthTimeout = 0x1e;
  (this->m_Values).m_EcOutputLevel = 1;
  (this->m_Values).m_NetTcpAbortOnClose = 0;
  (this->m_Values).m_Debug = 0;
  (this->m_Values).m_DbgStress = 0;
  (this->m_Values).m_DbgStressNetwork = 0;
  (this->m_Values).m_DbgStressNetwork = 0;
  (this->m_Values).m_DbgPref = 0;
  (this->m_Values).m_DbgGraphs = 0;
  (this->m_Values).m_DbgHitch = 0;
  str_copy((this->m_Values).m_DbgStressServer,"localhost",0x20);
  (this->m_Values).m_DbgResizable = 0;
  return;
}

Assistant:

void CConfigManager::Reset()
{
	#define MACRO_CONFIG_INT(Name,ScriptName,def,min,max,flags,desc) m_Values.m_##Name = def;
	#define MACRO_CONFIG_STR(Name,ScriptName,len,def,flags,desc) str_copy(m_Values.m_##Name, def, len);
	#define MACRO_CONFIG_UTF8STR(Name,ScriptName,size,len,def,flags,desc) str_utf8_copy_num(m_Values.m_##Name, def, size, len);

	#include "config_variables.h"

	#undef MACRO_CONFIG_INT
	#undef MACRO_CONFIG_STR
	#undef MACRO_CONFIG_UTF8STR
}